

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::TimezoneFun::GetFunctions(void)

{
  scalar_function_t *this;
  pointer pSVar1;
  LogicalType varargs;
  undefined8 *puVar2;
  ScalarFunctionSet *in_RDI;
  bind_scalar_function_t *pp_Var3;
  long lVar4;
  ScalarFunction *func;
  pointer function_00;
  byte bVar5;
  initializer_list<duckdb::LogicalType> __l;
  ScalarFunction function;
  function_statistics_t in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffc04;
  undefined4 in_stack_fffffffffffffc0c;
  undefined1 null_handling;
  undefined8 bind_lambda;
  undefined1 local_3c8 [48];
  scalar_function_t local_398;
  LogicalType local_378;
  vector<duckdb::LogicalType,_true> local_360;
  LogicalType local_348;
  undefined1 local_330 [144];
  LogicalType LStack_2a0;
  FunctionStability local_288;
  FunctionNullHandling FStack_287;
  FunctionErrors FStack_286;
  FunctionCollationHandling FStack_285;
  _Any_data _Stack_280;
  _Manager_type local_270;
  undefined8 auStack_260 [9];
  element_type *local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  bVar5 = 0;
  local_330._8_8_ = (pointer)0x0;
  local_330._0_8_ = DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::TimezoneOperator>;
  local_330._24_8_ =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_330._16_8_ =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_3c8._8_8_ = 0;
  local_3c8._0_8_ =
       DatePart::UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::TimezoneOperator>;
  local_3c8._24_8_ =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_3c8._16_8_ =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_398.super__Function_base._M_functor._8_8_ = 0;
  local_398.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::TimezoneOperator>;
  local_398._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_398.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  GetGenericDatePartFunction<(duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>(*)(duckdb::ExpressionState&,duckdb::BoundFunctionExpression_const&,duckdb::FunctionData*))0>
            (in_RDI,(duckdb *)local_330,(scalar_function_t *)local_3c8,&local_398,
             (scalar_function_t *)DatePart::TimezoneOperator::PropagateStatistics<duckdb::date_t>,
             DatePart::TimezoneOperator::PropagateStatistics<duckdb::timestamp_t>,
             in_stack_fffffffffffffbe8);
  if (local_398.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_398.super__Function_base._M_manager)
              ((_Any_data *)&local_398,(_Any_data *)&local_398,__destroy_functor);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c8._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)local_3c8._16_8_)(local_3c8,local_3c8,3);
  }
  if ((code *)local_330._16_8_ != (code *)0x0) {
    (*(code *)local_330._16_8_)(local_330,local_330,3);
  }
  LogicalType::LogicalType((LogicalType *)local_3c8,INTERVAL);
  LogicalType::LogicalType((LogicalType *)(local_3c8 + 0x18),TIME_TZ);
  __l._M_len = 2;
  __l._M_array = (iterator)local_3c8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_360,__l,
             (allocator_type *)&local_398);
  LogicalType::LogicalType(&local_378,TIME_TZ);
  bind_lambda = (bind_lambda_function_t)0x0;
  null_handling = 0x30;
  LogicalType::LogicalType(&local_348,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_348;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffc04;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffc0c;
  ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_330,&local_360,&local_378,
             (scalar_function_t *)&stack0xfffffffffffffc18,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,null_handling,(bind_lambda_function_t)bind_lambda);
  LogicalType::~LogicalType(&local_348);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xfffffffffffffc18,(_Any_data *)&stack0xfffffffffffffc18,
               __destroy_functor);
  LogicalType::~LogicalType(&local_378);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_360);
  lVar4 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_3c8 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_208,(SimpleFunction *)local_330);
  local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02439fe0;
  LogicalType::LogicalType(&local_208.super_BaseScalarFunction.return_type,&LStack_2a0);
  local_208.super_BaseScalarFunction.stability = local_288;
  local_208.super_BaseScalarFunction.null_handling = FStack_287;
  local_208.super_BaseScalarFunction.errors = FStack_286;
  local_208.super_BaseScalarFunction.collation_handling = FStack_285;
  local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024398b0;
  this = &local_208.function;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (this,(function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                   *)&_Stack_280);
  puVar2 = auStack_260;
  pp_Var3 = &local_208.bind;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pp_Var3 = (bind_scalar_function_t)*puVar2;
    puVar2 = puVar2 + (ulong)bVar5 * -2 + 1;
    pp_Var3 = pp_Var3 + (ulong)bVar5 * -2 + 1;
  }
  local_208.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_218;
  local_208.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_210._M_pi;
  if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_210._M_pi)->_M_use_count = (local_210._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_210._M_pi)->_M_use_count = (local_210._M_pi)->_M_use_count + 1;
    }
  }
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_208);
  local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024398b0;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  function_00 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function_00 != pSVar1) {
    do {
      BaseScalarFunction::SetReturnsError(&local_e0,&function_00->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function_00 = function_00 + 1;
    } while (function_00 != pSVar1);
  }
  local_330._0_8_ = &PTR__ScalarFunction_024398b0;
  if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210._M_pi);
  }
  if (local_270 != (_Manager_type)0x0) {
    (*local_270)(&_Stack_280,&_Stack_280,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_330);
  return in_RDI;
}

Assistant:

ScalarFunctionSet TimezoneFun::GetFunctions() {
	auto operator_set = GetDatePartFunction<DatePart::TimezoneOperator>();

	//	PG also defines timezone(INTERVAL, TIME_TZ) => TIME_TZ
	ScalarFunction function({LogicalType::INTERVAL, LogicalType::TIME_TZ}, LogicalType::TIME_TZ,
	                        DatePart::TimezoneOperator::BinaryFunction<interval_t, dtime_tz_t, dtime_tz_t>);

	operator_set.AddFunction(function);

	for (auto &func : operator_set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}

	return operator_set;
}